

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall nivalis::ParseSession::begin_thunk(ParseSession *this)

{
  iterator __position;
  unsigned_long local_18;
  _OpCode local_c;
  
  local_18 = (long)(this->result).ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->result).ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  __position._M_current =
       (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->thunks,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_c = thunk_ret;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
  emplace_back<nivalis::OpCode::_OpCode>(&(this->result).ast,&local_c);
  return;
}

Assistant:

void begin_thunk() {
        thunks.push_back(result.ast.size());
        result.ast.emplace_back(OpCode::thunk_ret);
    }